

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O2

int __thiscall
CVmObjVector::getp_to_list(CVmObjVector *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  ushort uVar1;
  CVmObjPageEntry *pCVar2;
  vm_datatype_t *pvVar3;
  vm_val_t *pvVar4;
  int iVar5;
  vm_obj_id_t vVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  size_t idx;
  vm_val_t val;
  
  if (argc == (uint *)0x0) {
    uVar10 = 0;
  }
  else {
    uVar10 = *argc;
  }
  if (getp_to_list(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    iVar5 = __cxa_guard_acquire(&getp_to_list(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    if (iVar5 != 0) {
      getp_to_list::desc.min_argc_ = 0;
      getp_to_list::desc.opt_argc_ = 2;
      getp_to_list::desc.varargs_ = 0;
      __cxa_guard_release(&getp_to_list(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    }
  }
  iVar5 = CVmObject::get_prop_check_argc(retval,argc,&getp_to_list::desc);
  if (iVar5 == 0) {
    uVar1 = *(ushort *)((this->super_CVmObjCollection).super_CVmObject.ext_ + 2);
    uVar7 = 1;
    if (uVar10 != 0) {
      iVar5 = CVmBif::pop_int_val();
      uVar7 = (iVar5 >> 0x1f & uVar1 + 1) + iVar5;
    }
    uVar9 = 1;
    if (1 < (int)uVar7) {
      uVar9 = uVar7;
    }
    uVar7 = (uint)uVar1;
    if (1 < uVar10) {
      uVar7 = CVmBif::pop_int_val();
    }
    pvVar4 = sp_;
    uVar8 = (uint)uVar1 - (uVar9 - 1);
    if ((int)uVar7 <= (int)uVar8) {
      uVar8 = uVar7;
    }
    idx = 0;
    if (uVar1 < uVar9) {
      uVar8 = 0;
    }
    pvVar3 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar3 = VM_OBJ;
    (pvVar4->val).obj = self;
    vVar6 = CVmObjList::create(0,(long)(int)uVar8);
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar6;
    pCVar2 = G_obj_table_X.pages_[vVar6 >> 0xc];
    if ((int)uVar8 < 1) {
      uVar8 = 0;
    }
    for (; uVar8 != idx; idx = idx + 1) {
      get_element(this,idx + (uVar9 - 1),&val);
      CVmObjList::cons_set_element((CVmObjList *)(pCVar2 + (vVar6 & 0xfff)),idx,&val);
    }
    sp_ = sp_ + -1;
  }
  return 1;
}

Assistant:

int CVmObjVector::getp_to_list(VMG_ vm_obj_id_t self, vm_val_t *retval,
                               uint *argc)
{
    int src_cnt;
    int dst_cnt;
    int start_idx;
    CVmObjList *lst;
    int idx;
    uint orig_argc = (argc != 0 ? *argc : 0);
    static CVmNativeCodeDesc desc(0, 2);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* note our size */
    src_cnt = get_element_count();

    /* 
     *   if there's a starting index, retrieve it; otherwise, start at our
     *   first element 
     */
    if (orig_argc >= 1)
        start_idx = (size_t)CVmBif::pop_int_val(vmg0_);
    else
        start_idx = 1;

    /* negative index values count from the end of the list */
    if (start_idx < 0)
        start_idx += src_cnt + 1;

    /* if the starting index is below 1, force it to 1 */
    if (start_idx < 1)
        start_idx = 1;

    /* adjust the starting index to a 0-based index */
    --start_idx;

    /* 
     *   if there's a size argument, retrieve it; if it's not specified,
     *   use our actual size for the output size 
     */
    if (orig_argc >= 2)
        dst_cnt = (size_t)CVmBif::pop_int_val(vmg0_);
    else
        dst_cnt = src_cnt;

    /* 
     *   in no case will the result list have more elements than we can
     *   actually supply 
     */
    if (start_idx >= src_cnt)
    {
        /* we're starting past our last element - we can't supply anything */
        dst_cnt = 0;
    }
    else if (src_cnt - start_idx < dst_cnt)
    {
        /* we can't supply as many values as requested - lower the size */
        dst_cnt = src_cnt - start_idx;
    }

    /* push a self-reference for garbage collection protection */
    G_stk->push()->set_obj(self);

    /* create the new list */
    retval->set_obj(CVmObjList::create(vmg_ FALSE, dst_cnt));
    lst = (CVmObjList *)vm_objp(vmg_ retval->val.obj);

    /* set the list elements */
    for (idx = 0 ; idx < dst_cnt ; ++idx)
    {
        vm_val_t val;

        /* get my element at this index */
        get_element(idx + start_idx, &val);

        /* store the element in the list */
        lst->cons_set_element(idx, &val);
    }

    /* discard the self-reference */
    G_stk->discard();

    /* handled */
    return TRUE;
}